

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O3

bool brynet::net::WebSocketFormat::wsFrameExtractBuffer
               (char *inbuffer,size_t bufferSize,string *payload,WebSocketFrameType *outopcode,
               size_t *frameSize,bool *outfin)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  uint8_t mask [4];
  
  if (bufferSize < 2) {
    return false;
  }
  *outfin = (bool)((byte)*inbuffer >> 7);
  *outopcode = (byte)*inbuffer & 0xf;
  uVar2 = (byte)inbuffer[1] & 0x7f;
  if (uVar2 == 0x7e) {
    if (bufferSize < 4) {
      return false;
    }
    uVar2 = (uint)(byte)inbuffer[2] << 8;
    uVar1 = 4;
    lVar4 = 3;
LAB_0013430a:
    uVar2 = (byte)inbuffer[lVar4] | uVar2;
  }
  else {
    uVar1 = 2;
    if ((char)uVar2 == '\x7f') {
      if (bufferSize < 10) {
        return false;
      }
      if (inbuffer[2] != '\0') {
        return false;
      }
      if (inbuffer[3] != '\0') {
        return false;
      }
      if (inbuffer[4] != '\0') {
        return false;
      }
      if (inbuffer[5] != '\0') {
        return false;
      }
      if (inbuffer[6] < '\0') {
        return false;
      }
      uVar2 = (uint)(byte)inbuffer[8] << 8 |
              (uint)(byte)inbuffer[7] << 0x10 | (int)inbuffer[6] << 0x18;
      uVar1 = 10;
      lVar4 = 9;
      goto LAB_0013430a;
    }
  }
  if (inbuffer[1] < '\0') {
    if (((ulong)uVar1 + 4 <= bufferSize) &&
       (sVar5 = (size_t)((int)((ulong)uVar1 + 4) + uVar2), sVar5 <= bufferSize)) {
      std::__cxx11::string::reserve((ulong)payload);
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          std::__cxx11::string::push_back((char)payload);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      goto LAB_00134393;
    }
  }
  else {
    sVar5 = (size_t)(uVar1 + uVar2);
    if (sVar5 <= bufferSize) {
      std::__cxx11::string::append((char *)payload,(ulong)(inbuffer + uVar1));
LAB_00134393:
      *frameSize = sVar5;
      return true;
    }
  }
  return false;
}

Assistant:

static bool wsFrameExtractBuffer(const char* inbuffer, 
                const size_t bufferSize, 
                std::string& payload, 
                WebSocketFrameType& outopcode, 
                size_t& frameSize, 
                bool& outfin)
            {
                const unsigned char* buffer = (const unsigned char*)inbuffer;

                if (bufferSize < 2)
                {
                    return false;
                }

                outfin = (buffer[0] & 0x80) != 0;
                outopcode = (WebSocketFrameType)(buffer[0] & 0x0F);
                const bool isMasking = (buffer[1] & 0x80) != 0;
                uint32_t payloadlen = buffer[1] & 0x7F;

                uint32_t pos = 2;
                if (payloadlen == 126)
                {
                    if (bufferSize < 4)
                    {
                        return false;
                    }

                    payloadlen = (buffer[2] << 8) + buffer[3];
                    pos = 4;
                }
                else if (payloadlen == 127)
                {
                    if (bufferSize < 10)
                    {
                        return false;
                    }

                    if (buffer[2] != 0 ||
                        buffer[3] != 0 ||
                        buffer[4] != 0 ||
                        buffer[5] != 0)
                    {
                        return false;
                    }

                    if ((buffer[6] & 0x80) != 0)
                    {
                        return false;
                    }

                    payloadlen = (buffer[6] << 24) + (buffer[7] << 16) + (buffer[8] << 8) + buffer[9];
                    pos = 10;
                }

                uint8_t mask[4];
                if (isMasking)
                {
                    if (bufferSize < (pos + 4))
                    {
                        return false;
                    }

                    mask[0] = buffer[pos++];
                    mask[1] = buffer[pos++];
                    mask[2] = buffer[pos++];
                    mask[3] = buffer[pos++];
                }

                if (bufferSize < (pos + payloadlen))
                {
                    return false;
                }

                if (isMasking)
                {
                    payload.reserve(payloadlen);
                    for (size_t i = pos, j = 0; j < payloadlen; i++, j++)
                        payload.push_back(buffer[i] ^ mask[j % 4]);
                }
                else
                {
                    payload.append((const char*)(buffer + pos), payloadlen);
                }

                frameSize = payloadlen + pos;

                return true;
            }